

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal.cpp
# Opt level: O1

void __thiscall Signal::set(Signal *this)

{
  code *pcVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this->mdata);
  if (iVar2 != 0) {
    iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Signal.cpp"
                          ,0x28,"pthread_mutex_lock((pthread_mutex_t*)mdata) == 0");
    if (iVar2 != 0) goto LAB_00112da6;
  }
  this->signaled = true;
  iVar2 = pthread_mutex_unlock((pthread_mutex_t *)this->mdata);
  if (iVar2 != 0) {
    iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Signal.cpp"
                          ,0x2a,"pthread_mutex_unlock((pthread_mutex_t*)mdata) == 0");
    if (iVar2 != 0) goto LAB_00112da6;
  }
  iVar2 = pthread_cond_broadcast((pthread_cond_t *)this);
  if (iVar2 != 0) {
    iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Signal.cpp"
                          ,0x2b,"pthread_cond_broadcast((pthread_cond_t*)cdata) == 0");
    if (iVar2 != 0) {
LAB_00112da6:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  return;
}

Assistant:

void Signal::set()
{
#ifdef _WIN32
  VERIFY(SetEvent(handle));
#else
  VERIFY(pthread_mutex_lock((pthread_mutex_t*)mdata) == 0);
  signaled = true;
  VERIFY(pthread_mutex_unlock((pthread_mutex_t*)mdata) == 0);
  VERIFY(pthread_cond_broadcast((pthread_cond_t*)cdata) == 0);
#endif
}